

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::
cni_holder<void_(cs_impl::member_visitor::*)(const_cs_impl::any_&)_const,_void_(*)(const_cs_impl::member_visitor_&,_const_cs_impl::any_&)>
::cni_holder(cni_holder<void_(cs_impl::member_visitor::*)(const_cs_impl::any_&)_const,_void_(*)(const_cs_impl::member_visitor_&,_const_cs_impl::any_&)>
             *this,offset_in_member_visitor_to_subr *func)

{
  function<void_(const_cs_impl::member_visitor_&,_const_cs_impl::any_&)> *in_RDI;
  cni_helper<void_(*)(const_cs_impl::member_visitor_&,_const_cs_impl::any_&),_void_(*)(const_cs_impl::member_visitor_&,_const_cs_impl::any_&)>
  *this_00;
  offset_in_member_visitor_to_subr *in_stack_ffffffffffffffc8;
  function<void_(const_cs_impl::member_visitor_&,_const_cs_impl::any_&)> *in_stack_ffffffffffffffd0;
  
  cni_holder_base::cni_holder_base((cni_holder_base *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__cni_holder_003c02f0;
  this_00 = (cni_helper<void_(*)(const_cs_impl::member_visitor_&,_const_cs_impl::any_&),_void_(*)(const_cs_impl::member_visitor_&,_const_cs_impl::any_&)>
             *)((long)&(in_RDI->super__Function_base)._M_functor + 8);
  std::function<void(cs_impl::member_visitor_const&,cs_impl::any_const&)>::
  function<void(cs_impl::member_visitor::*const&)(cs_impl::any_const&)const,void>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  cni_helper<void_(*)(const_cs_impl::member_visitor_&,_const_cs_impl::any_&),_void_(*)(const_cs_impl::member_visitor_&,_const_cs_impl::any_&)>
  ::cni_helper(this_00,in_RDI);
  std::function<void_(const_cs_impl::member_visitor_&,_const_cs_impl::any_&)>::~function
            ((function<void_(const_cs_impl::member_visitor_&,_const_cs_impl::any_&)> *)0x27f806);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}